

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O2

float binarySearch(float fhat,float delta,float sens,float tol)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar3 = 3.4028235e+38;
  if (fhat / sens <= 3.4028235e+38) {
    fVar3 = fhat / sens;
  }
  fVar2 = fVar3;
  if (delta < fVar3 * fhat * fhat) {
    iVar1 = 0x15;
    fVar2 = 0.0;
    while (iVar1 = iVar1 + -1, iVar1 != 0) {
      fVar4 = (fVar2 + fVar3) * 0.5;
      fVar6 = -sens * fVar4 + fhat;
      fVar5 = (fhat * fhat - fVar6 * fVar6) * fVar4 + -delta;
      fVar6 = fVar4;
      if (fVar5 <= 0.0) {
        fVar6 = fVar3;
      }
      fVar3 = fVar6;
      fVar2 = (float)((uint)fVar2 & -(uint)(0.0 < fVar5) | ~-(uint)(0.0 < fVar5) & (uint)fVar4);
      if (ABS(fVar5) <= tol) {
        return fVar2;
      }
      if (fVar3 - fVar2 <= tol) {
        return fVar2;
      }
    }
  }
  return fVar2;
}

Assistant:

float binarySearch(float fhat, float delta, float sens, float tol)
{
  float maxw = min(fhat / sens, FLT_MAX);

  if (maxw * fhat * fhat <= delta)
    return maxw;

  float l = 0, u = maxw, w, v;

  for (int iter = 0; iter < B_SEARCH_MAX_ITER; iter++)
  {
    w = (u + l) / 2.f;
    v = w * (fhat * fhat - (fhat - sens * w) * (fhat - sens * w)) - delta;
    if (v > 0)
      u = w;
    else
      l = w;
    if (fabs(v) <= tol || u - l <= tol)
      break;
  }

  return l;
}